

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pColorIdx,
          list<aiColor3D,_std::allocator<aiColor3D>_> *pColors,bool pColorPerVertex)

{
  float _r;
  float _g;
  bool bVar1;
  reference paVar2;
  aiColor4t<float> local_70;
  _Self local_60;
  _Self local_58;
  const_iterator it;
  list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> tcol;
  bool pColorPerVertex_local;
  list<aiColor3D,_std::allocator<aiColor3D>_> *pColors_local;
  vector<int,_std::allocator<int>_> *pColorIdx_local;
  vector<int,_std::allocator<int>_> *pCoordIdx_local;
  aiMesh *pMesh_local;
  X3DImporter *this_local;
  
  std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::list
            ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&it);
  local_58._M_node =
       (_List_node_base *)std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::begin(pColors);
  while( true ) {
    local_60._M_node =
         (_List_node_base *)std::__cxx11::list<aiColor3D,_std::allocator<aiColor3D>_>::end(pColors);
    bVar1 = std::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    paVar2 = std::_List_const_iterator<aiColor3D>::operator*(&local_58);
    _r = paVar2->r;
    paVar2 = std::_List_const_iterator<aiColor3D>::operator*(&local_58);
    _g = paVar2->g;
    paVar2 = std::_List_const_iterator<aiColor3D>::operator*(&local_58);
    aiColor4t<float>::aiColor4t(&local_70,_r,_g,paVar2->b,1.0);
    std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
              ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&it,&local_70);
    std::_List_const_iterator<aiColor3D>::operator++(&local_58);
  }
  MeshGeometry_AddColor
            (this,pMesh,pCoordIdx,pColorIdx,
             (list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&it,pColorPerVertex);
  std::__cxx11::list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::~list
            ((list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)&it);
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pColorIdx,
										const std::list<aiColor3D>& pColors, const bool pColorPerVertex) const
{
    std::list<aiColor4D> tcol;

	// create RGBA array from RGB.
    for ( std::list<aiColor3D>::const_iterator it = pColors.begin(); it != pColors.end(); ++it )
    {
        tcol.push_back( aiColor4D( ( *it ).r, ( *it ).g, ( *it ).b, 1 ) );
    }

	// call existing function for adding RGBA colors
	MeshGeometry_AddColor(pMesh, pCoordIdx, pColorIdx, tcol, pColorPerVertex);
}